

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCare.c
# Opt level: O2

Abc_Cex_t *
Bmc_CexCareMinimizeAig
          (Gia_Man_t *p,int nRealPis,Abc_Cex_t *pCex,int nTryCexes,int fCheck,int fVerbose)

{
  Abc_Cex_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  ulong uVar4;
  ulong uVar5;
  Gia_Obj_t *pGVar6;
  Abc_Cex_t *pAVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  Abc_Cex_t **p_03;
  int iVar15;
  bool bVar16;
  Abc_Cex_t *pCexMin [4];
  
  pCexMin[2] = (Abc_Cex_t *)0x0;
  pCexMin[3] = (Abc_Cex_t *)0x0;
  pCexMin[0] = (Abc_Cex_t *)0x0;
  pCexMin[1] = (Abc_Cex_t *)0x0;
  iVar3 = pCex->nPis;
  iVar12 = p->nRegs;
  if (iVar3 == p->vCis->nSize - iVar12) {
    if (pCex->nRegs == iVar12) {
      if ((-1 < pCex->iPo) && (pCex->iPo < p->vCos->nSize - iVar12)) {
        if (fVerbose != 0) {
          printf("Original :    ");
          Bmc_CexPrint(pCex,nRealPis,0);
          iVar3 = pCex->nPis;
        }
        p_01 = Vec_IntAlloc((pCex->iFrame + 1) * iVar3);
        p_02 = Vec_IntAlloc((pCex->iFrame + 1) * pCex->nRegs);
        iVar3 = 0;
        if (0 < nRealPis) {
          iVar3 = nRealPis;
        }
        uVar4 = 0;
        if (0 < nTryCexes) {
          uVar4 = (ulong)(uint)nTryCexes;
        }
        uVar13 = 0;
        while( true ) {
          if (uVar13 == uVar4) {
            Vec_IntFree(p_01);
            Vec_IntFree(p_02);
            pAVar7 = pCexMin[0];
            iVar3 = Abc_CexCountOnes(pCexMin[0]);
            for (lVar14 = 1; lVar14 < nTryCexes; lVar14 = lVar14 + 1) {
              p_00 = pCexMin[lVar14];
              if (p_00 != (Abc_Cex_t *)0x0) {
                iVar10 = Abc_CexCountOnes(p_00);
                iVar12 = iVar3;
                if (iVar10 <= iVar3) {
                  iVar12 = iVar10;
                }
                bVar16 = iVar10 < iVar3;
                iVar3 = iVar12;
                if (bVar16) {
                  pAVar7 = p_00;
                }
              }
            }
            if (fVerbose != 0) {
              printf("Final    :    ");
              Bmc_CexPrint(pAVar7,nRealPis,0);
            }
            p_03 = pCexMin;
            while (bVar16 = uVar4 != 0, uVar4 = uVar4 - 1, bVar16) {
              if ((*p_03 != (Abc_Cex_t *)0x0) && (pAVar7 != *p_03)) {
                Abc_CexFreeP(p_03);
              }
              p_03 = p_03 + 1;
            }
            iVar3 = Bmc_CexVerify(p,pCex,pAVar7);
            if (iVar3 == 0) {
              pcVar11 = "Counter-example verification has failed.";
            }
            else {
              if (fCheck == 0) {
                return pAVar7;
              }
              pcVar11 = "Counter-example verification succeeded.";
            }
            puts(pcVar11);
            return pAVar7;
          }
          uVar9 = (pCex->iFrame + 1) * pCex->nPis;
          Vec_IntGrow(p_01,uVar9);
          uVar5 = 0;
          if (0 < (int)uVar9) {
            uVar5 = (ulong)uVar9;
          }
          for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
            p_01->pArray[uVar8] = 0;
          }
          p_01->nSize = uVar9;
          if (uVar13 == 0) {
            iVar10 = 0;
            for (iVar12 = pCex->iFrame; -1 < iVar12; iVar12 = iVar12 + -1) {
              for (iVar15 = ~p->nRegs + p->vCis->nSize; nRealPis < iVar15 + 1; iVar15 = iVar15 + -1)
              {
                iVar1 = pCex->nPis * iVar12;
                uVar9 = iVar1 + pCex->nRegs + iVar15;
                iVar2 = Abc_Var2Lit(iVar10,(uint)(((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >>
                                                   (uVar9 & 0x1f) & 1) != 0));
                Vec_IntWriteEntry(p_01,iVar15 + iVar1,iVar2);
                iVar10 = iVar10 + 1;
              }
            }
            for (iVar12 = pCex->iFrame; iVar15 = nRealPis + -1, -1 < iVar12; iVar12 = iVar12 + -1) {
              for (; 0 < iVar15 + 1; iVar15 = iVar15 + -1) {
                iVar1 = pCex->nPis * iVar12;
                uVar9 = iVar1 + pCex->nRegs + iVar15;
                iVar2 = Abc_Var2Lit(iVar10,(uint)(((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >>
                                                   (uVar9 & 0x1f) & 1) != 0));
                Vec_IntWriteEntry(p_01,iVar15 + iVar1,iVar2);
                iVar10 = iVar10 + 1;
              }
            }
          }
          else {
            iVar12 = (int)uVar13;
            if (iVar12 == 3) {
              iVar10 = 0;
              for (iVar12 = pCex->iFrame; iVar15 = nRealPis, -1 < iVar12; iVar12 = iVar12 + -1) {
                for (; iVar15 < p->vCis->nSize - p->nRegs; iVar15 = iVar15 + 1) {
                  iVar1 = pCex->nPis * iVar12;
                  uVar9 = iVar1 + pCex->nRegs + iVar15;
                  iVar2 = Abc_Var2Lit(iVar10,(uint)(((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >>
                                                     (uVar9 & 0x1f) & 1) != 0));
                  Vec_IntWriteEntry(p_01,iVar15 + iVar1,iVar2);
                  iVar10 = iVar10 + 1;
                }
              }
              for (iVar12 = pCex->iFrame; -1 < iVar12; iVar12 = iVar12 + -1) {
                for (iVar15 = 0; iVar3 != iVar15; iVar15 = iVar15 + 1) {
                  iVar1 = pCex->nPis * iVar12;
                  uVar9 = iVar1 + pCex->nRegs + iVar15;
                  iVar2 = Abc_Var2Lit(iVar15 + iVar10,
                                      (uint)(((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >>
                                              (uVar9 & 0x1f) & 1) != 0));
                  Vec_IntWriteEntry(p_01,iVar15 + iVar1,iVar2);
                }
                iVar10 = iVar15 + iVar10;
              }
            }
            else if (iVar12 == 2) {
              iVar10 = 0;
              for (iVar12 = pCex->iFrame; iVar15 = nRealPis, -1 < iVar12; iVar12 = iVar12 + -1) {
                for (; iVar15 < p->vCis->nSize - p->nRegs; iVar15 = iVar15 + 1) {
                  iVar1 = pCex->nPis * iVar12;
                  uVar9 = iVar1 + pCex->nRegs + iVar15;
                  iVar2 = Abc_Var2Lit(iVar10,(uint)(((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >>
                                                     (uVar9 & 0x1f) & 1) != 0));
                  Vec_IntWriteEntry(p_01,iVar15 + iVar1,iVar2);
                  iVar10 = iVar10 + 1;
                }
              }
              for (iVar12 = pCex->iFrame; iVar15 = nRealPis + -1, -1 < iVar12; iVar12 = iVar12 + -1)
              {
                for (; 0 < iVar15 + 1; iVar15 = iVar15 + -1) {
                  iVar1 = pCex->nPis * iVar12;
                  uVar9 = iVar1 + pCex->nRegs + iVar15;
                  iVar2 = Abc_Var2Lit(iVar10,(uint)(((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >>
                                                     (uVar9 & 0x1f) & 1) != 0));
                  Vec_IntWriteEntry(p_01,iVar15 + iVar1,iVar2);
                  iVar10 = iVar10 + 1;
                }
              }
            }
            else {
              if (iVar12 != 1) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                              ,0x16c,
                              "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                             );
              }
              iVar10 = 0;
              for (iVar12 = pCex->iFrame; -1 < iVar12; iVar12 = iVar12 + -1) {
                for (iVar15 = ~p->nRegs + p->vCis->nSize; nRealPis < iVar15 + 1;
                    iVar15 = iVar15 + -1) {
                  iVar1 = pCex->nPis * iVar12;
                  uVar9 = iVar1 + pCex->nRegs + iVar15;
                  iVar2 = Abc_Var2Lit(iVar10,(uint)(((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >>
                                                     (uVar9 & 0x1f) & 1) != 0));
                  Vec_IntWriteEntry(p_01,iVar15 + iVar1,iVar2);
                  iVar10 = iVar10 + 1;
                }
              }
              for (iVar12 = pCex->iFrame; -1 < iVar12; iVar12 = iVar12 + -1) {
                for (iVar15 = 0; iVar3 != iVar15; iVar15 = iVar15 + 1) {
                  iVar1 = pCex->nPis * iVar12;
                  uVar9 = iVar1 + pCex->nRegs + iVar15;
                  iVar2 = Abc_Var2Lit(iVar15 + iVar10,
                                      (uint)(((uint)(&pCex[1].iPo)[(int)uVar9 >> 5] >>
                                              (uVar9 & 0x1f) & 1) != 0));
                  Vec_IntWriteEntry(p_01,iVar15 + iVar1,iVar2);
                }
                iVar10 = iVar15 + iVar10;
              }
            }
          }
          if (iVar10 != (pCex->iFrame + 1) * pCex->nPis) {
            __assert_fail("Counter == pCex->nPis * (pCex->iFrame + 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                          ,0x16e,
                          "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                         );
          }
          Bmc_CexCarePropagateFwd(p,pCex,p_01,p_02);
          if (p_02->nSize != (pCex->iFrame + 1) * pCex->nRegs) {
            __assert_fail("Vec_IntSize(vPriosFf) == pCex->nRegs * (pCex->iFrame + 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                          ,0x170,
                          "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                         );
          }
          pGVar6 = Gia_ManPo(p,pCex->iPo);
          iVar12 = Abc_LitIsCompl(pGVar6->Value);
          if (iVar12 == 0) break;
          pAVar7 = Bmc_CexCarePropagateBwd(p,pCex,p_01,p_02);
          pCexMin[uVar13] = pAVar7;
          if (fVerbose != 0) {
            pcVar11 = "PI-  PPI-:    ";
            if (uVar13 != 0) {
              if (3 < uVar13) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCare.c"
                              ,0x183,
                              "Abc_Cex_t *Bmc_CexCareMinimizeAig(Gia_Man_t *, int, Abc_Cex_t *, int, int, int)"
                             );
              }
              pcVar11 = &DAT_0080f9b4 +
                        *(int *)(&DAT_0080f9b4 + ((long)((uVar13 << 0x20) + -0x100000000) >> 0x1e));
            }
            printf(pcVar11);
            Bmc_CexPrint(pAVar7,nRealPis,0);
          }
          uVar13 = uVar13 + 1;
        }
        puts("Counter-example is invalid.");
        Vec_IntFree(p_01);
        Vec_IntFree(p_02);
        return (Abc_Cex_t *)0x0;
      }
      pcVar11 = "Given CEX has PO whose index is out of range for the AIG.";
    }
    else {
      pcVar11 = "Given CEX does to have same number of flops as the AIG.";
    }
  }
  else {
    pcVar11 = "Given CEX does to have same number of inputs as the AIG.";
  }
  puts(pcVar11);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Bmc_CexCareMinimizeAig( Gia_Man_t * p, int nRealPis, Abc_Cex_t * pCex, int nTryCexes, int fCheck, int fVerbose )
{
    //int nTryCexes = 4; // belongs to range [1;4]
    Abc_Cex_t * pCexBest, * pCexMin[4] = {NULL};
    int k, f, i, nOnesBest, nOnesCur, Counter = 0;
    Vec_Int_t * vPriosIn, * vPriosFf;
    if ( pCex->nPis != Gia_ManPiNum(p) )
    {
        printf( "Given CEX does to have same number of inputs as the AIG.\n" );
        return NULL;
    }
    if ( pCex->nRegs != Gia_ManRegNum(p) )
    {
        printf( "Given CEX does to have same number of flops as the AIG.\n" );
        return NULL;
    }
    if ( !(pCex->iPo >= 0 && pCex->iPo < Gia_ManPoNum(p)) )
    {
        printf( "Given CEX has PO whose index is out of range for the AIG.\n" );
        return NULL;
    }
    assert( pCex->nPis == Gia_ManPiNum(p) );
    assert( pCex->nRegs == Gia_ManRegNum(p) );
    assert( pCex->iPo >= 0 && pCex->iPo < Gia_ManPoNum(p) );
    if ( fVerbose )
    {
        printf( "Original :    " );
        Bmc_CexPrint( pCex, nRealPis, 0 );
    }
    vPriosIn = Vec_IntAlloc( pCex->nPis  * (pCex->iFrame + 1) );
    vPriosFf = Vec_IntAlloc( pCex->nRegs * (pCex->iFrame + 1) );
    for ( k = 0; k < nTryCexes; k++ )
    {
        Counter = 0;
        Vec_IntFill( vPriosIn, pCex->nPis * (pCex->iFrame + 1), 0 );
/*
        if ( k == 0 )
        {
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 1 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 2 )
        {
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = 0; f <= pCex->iFrame; f++ )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 3 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else assert( 0 );
*/
        if ( k == 0 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 1 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = Gia_ManPiNum(p) - 1; i >= nRealPis; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 2 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis - 1; i >= 0; i-- )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else if ( k == 3 )
        {
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = nRealPis; i < Gia_ManPiNum(p); i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
            for ( f = pCex->iFrame; f >= 0; f-- )
                for ( i = 0; i < nRealPis; i++ )
                    Vec_IntWriteEntry( vPriosIn, f * pCex->nPis + i, Abc_Var2Lit(Counter++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i)) );
        }
        else assert( 0 );

        assert( Counter == pCex->nPis * (pCex->iFrame + 1) );
        Bmc_CexCarePropagateFwd( p, pCex, vPriosIn, vPriosFf );
        assert( Vec_IntSize(vPriosFf) == pCex->nRegs * (pCex->iFrame + 1) );
        if ( !Abc_LitIsCompl(Gia_ManPo(p, pCex->iPo)->Value) )
        {
            printf( "Counter-example is invalid.\n" );
            Vec_IntFree( vPriosIn );
            Vec_IntFree( vPriosFf );
            return NULL;
        }
        pCexMin[k] = Bmc_CexCarePropagateBwd( p, pCex, vPriosIn, vPriosFf );
        if ( fVerbose )
        {
            if ( k == 0 )
                printf( "PI-  PPI-:    " );
            else if ( k == 1 )
                printf( "PI+  PPI-:    " );
            else if ( k == 2 )
                printf( "PI-  PPI+:    " );
            else if ( k == 3 )
                printf( "PI+  PPI+:    " );
            else assert( 0 );
            Bmc_CexPrint( pCexMin[k], nRealPis, 0 );
        }
    }
    Vec_IntFree( vPriosIn );
    Vec_IntFree( vPriosFf );
    // select the best one
    pCexBest  = pCexMin[0];
    nOnesBest = Abc_CexCountOnes(pCexMin[0]);
    for ( k = 1; k < nTryCexes; k++ )
    {
        if ( pCexMin[k] == NULL )
            continue;
        nOnesCur = Abc_CexCountOnes(pCexMin[k]);
        if ( nOnesBest > nOnesCur )
        {
            nOnesBest = nOnesCur;
            pCexBest  = pCexMin[k];
        }
    }
    if ( fVerbose )
    {
        //Abc_Cex_t * pTotal = Bmc_CexCareTotal( pCexMin, nTryCexes );
        printf( "Final    :    " );
        Bmc_CexPrint( pCexBest, nRealPis, 0 );
        //printf( "Total    :    " );
        //Bmc_CexPrint( pTotal, nRealPis, 0 );
        //Abc_CexFreeP( &pTotal );
    }
    for ( k = 0; k < nTryCexes; k++ )
        if ( pCexMin[k] && pCexBest != pCexMin[k] )
            Abc_CexFreeP( &pCexMin[k] );
    // verify and return
    if ( !Bmc_CexVerify( p, pCex, pCexBest ) )
        printf( "Counter-example verification has failed.\n" );
    else if ( fCheck ) 
        printf( "Counter-example verification succeeded.\n" );
    return pCexBest;
}